

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCompression.cpp
# Opt level: O1

void testTiledCompression(string *tempDir)

{
  int w;
  int h;
  double dVar1;
  double dVar2;
  char cVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  uint *__s;
  half *phVar7;
  float *__s_00;
  ostream *poVar8;
  long *plVar9;
  long lVar10;
  float fVar11;
  int y;
  long lVar12;
  ulong uVar13;
  int x;
  uint *puVar14;
  Array2D<float> pf;
  Array2D<Imath_3_2::half> ph;
  Array2D<unsigned_int> pi;
  int in_stack_ffffffffffffff18;
  float *pfVar15;
  int in_stack_ffffffffffffff28;
  long lVar16;
  ushort local_b6 [3];
  string *local_b0;
  half *local_a8;
  uint *local_a0;
  Array2D<float> local_98;
  Array2D<Imath_3_2::half> local_80;
  Array2D<unsigned_int> local_68;
  long local_50;
  double local_48;
  double local_40;
  double local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Testing pixel data types and data window offsets for tiled files",0x40);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  local_68._sizeX = 0x3b;
  local_68._sizeY = 0xab;
  __s = (uint *)operator_new__(0x9da4);
  local_80._sizeX = 0x3b;
  local_80._sizeY = 0xab;
  local_68._data = __s;
  phVar7 = (half *)operator_new__(0x4ed2);
  local_98._sizeX = 0x3b;
  local_98._sizeY = 0xab;
  local_80._data = phVar7;
  __s_00 = (float *)operator_new__(0x9da4);
  lVar16 = 0;
  local_b0 = tempDir;
  local_a8 = phVar7;
  local_a0 = __s;
  local_98._data = __s_00;
  do {
    phVar7 = local_a8;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"xOffset = ",10);
    w = *(int *)(&DAT_001c6b78 + lVar16 * 4);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,w);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", yOffset = ",0xc);
    h = *(int *)(&DAT_001c6b84 + lVar16 * 4);
    plVar9 = (long *)std::ostream::operator<<(poVar8,h);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"only zeroes",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    memset(__s,0,0x9da4);
    memset(phVar7,0,0x4ed2);
    memset(__s_00,0,0x9da4);
    anon_unknown.dwarf_3166b7::writeRead
              (tempDir,&local_68,&local_80,&local_98,w,h,in_stack_ffffffffffffff18,(int)__s_00,
               in_stack_ffffffffffffff28,(int)lVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pattern 1",9);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    testTiledCompression();
    anon_unknown.dwarf_3166b7::writeRead
              (tempDir,&local_68,&local_80,&local_98,w,h,in_stack_ffffffffffffff18,(int)__s_00,
               in_stack_ffffffffffffff28,(int)lVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pattern 2",9);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    iVar5 = 0;
    lVar10 = 0;
    pfVar15 = __s_00;
    do {
      local_40 = (double)(int)lVar10;
      local_48 = local_40 * 0.5;
      lVar12 = -0xab;
      uVar13 = 0;
      local_50 = lVar10;
      do {
        __s[lVar12 + 0xab] = iVar5 + (int)(uVar13 / 100) * -100 + (int)lVar12 + 0xab;
        local_38 = (double)((int)lVar12 + 0xab);
        dVar1 = sin(local_38);
        dVar2 = sin(local_48);
        fVar11 = ABS((float)(dVar2 + dVar1));
        uVar4 = (ushort)((uint)(float)(dVar2 + dVar1) >> 0x10) & 0x8000;
        if ((uint)fVar11 < 0x38800000) {
          if ((0x33000000 < (uint)fVar11) &&
             (uVar6 = (uint)fVar11 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar11 >> 0x17),
             uVar4 = uVar4 | (ushort)(uVar6 >> (0x7eU - cVar3 & 0x1f)),
             0x80000000 < uVar6 << (cVar3 + 0xa2U & 0x1f))) {
            uVar4 = uVar4 + 1;
          }
        }
        else if ((uint)fVar11 < 0x7f800000) {
          if ((uint)fVar11 < 0x477ff000) {
            uVar4 = (ushort)((int)fVar11 + 0x8000fff + (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd
                            ) | uVar4;
          }
          else {
            uVar4 = uVar4 | 0x7c00;
          }
        }
        else {
          uVar4 = uVar4 | 0x7c00;
          if (fVar11 != INFINITY) {
            uVar6 = (uint)fVar11 >> 0xd & 0x3ff;
            uVar4 = uVar4 | (ushort)uVar6 | (ushort)(uVar6 == 0);
          }
        }
        phVar7[lVar12 + 0xab]._h = uVar4;
        dVar1 = sin(local_40);
        dVar2 = sin(local_38 * 0.5);
        __s_00[lVar12 + 0xab] = (float)(dVar2 + dVar1);
        uVar13 = (ulong)((int)uVar13 + 1);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0);
      lVar10 = local_50 + 1;
      __s_00 = __s_00 + 0xab;
      phVar7 = phVar7 + 0xab;
      __s = __s + 0xab;
      iVar5 = iVar5 + 100;
    } while (lVar10 != 0x3b);
    anon_unknown.dwarf_3166b7::writeRead
              (local_b0,&local_68,&local_80,&local_98,w,h,in_stack_ffffffffffffff18,(int)pfVar15,
               in_stack_ffffffffffffff28,(int)lVar16);
    puVar14 = local_a0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"random bits",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    local_b6[0] = 0x5a5a;
    local_b6[1] = 0x5a5a;
    local_b6[2] = 0x5a5a;
    lVar10 = 0;
    do {
      phVar7 = local_a8;
      lVar12 = 0;
      __s_00 = pfVar15;
      do {
        uVar6 = Imath_3_2::nrand48(local_b6);
        puVar14[lVar10 * 0xab + lVar12] = uVar6;
        do {
          do {
            uVar4 = Imath_3_2::nrand48(local_b6);
            phVar7[lVar10 * 0xab + lVar12]._h = uVar4;
          } while ((uVar4 & 0x7fff) == 0x7c00);
        } while ((~uVar4 & 0x7c00) == 0 && (uVar4 & 0x3ff) != 0);
        do {
          fVar11 = (float)Imath_3_2::nrand48(local_b6);
          __s = local_a0;
          tempDir = local_b0;
          pfVar15[lVar10 * 0xab + lVar12] = fVar11;
        } while (0x7f7fffff < (uint)ABS(fVar11));
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0xab);
      lVar10 = lVar10 + 1;
      puVar14 = local_a0;
      pfVar15 = __s_00;
    } while (lVar10 != 0x3b);
    anon_unknown.dwarf_3166b7::writeRead
              (local_b0,&local_68,&local_80,&local_98,w,h,in_stack_ffffffffffffff18,(int)__s_00,
               in_stack_ffffffffffffff28,(int)lVar16);
    phVar7 = local_a8;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  operator_delete__(__s_00);
  operator_delete__(phVar7);
  operator_delete__(__s);
  return;
}

Assistant:

void
testTiledCompression (const std::string& tempDir)
{
    try
    {
        cout << "Testing pixel data types and data "
                "window offsets for tiled files"
             << endl;

        const int W    = 171;
        const int H    = 59;
        const int DX[] = {-17, 0, 23};
        const int DY[] = {-29, 0, 13};
        const int XS   = 15;
        const int YS   = 15;

        Array2D<unsigned int> pi (H, W);
        Array2D<half>         ph (H, W);
        Array2D<float>        pf (H, W);

        //
        // If the following assertion fails, new pixel types have
        // been added to the Imf library; testing code for the new
        // pixel types should be added to this file.
        //

        assert (NUM_PIXELTYPES == 3);

        for (int i = 0; i < 3; ++i)
        {
            cout << endl
                 << "xOffset = " << DX[i]
                 << ", "
                    "yOffset = "
                 << DY[i] << endl;

            fillPixels1 (pi, ph, pf, W, H);
            writeRead (tempDir, pi, ph, pf, W, H, XS, YS, DX[i], DY[i]);

            fillPixels2 (pi, ph, pf, W, H);
            writeRead (tempDir, pi, ph, pf, W, H, XS, YS, DX[i], DY[i]);

            fillPixels3 (pi, ph, pf, W, H);
            writeRead (tempDir, pi, ph, pf, W, H, XS, YS, DX[i], DY[i]);

            fillPixels4 (pi, ph, pf, W, H);
            writeRead (tempDir, pi, ph, pf, W, H, XS, YS, DX[i], DY[i]);
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}